

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O2

void coins_tests::WriteCoinsViewEntry(CCoinsView *view,CAmount value,char flags)

{
  long lVar1;
  int iVar2;
  allocator_type *__a;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  check_type cVar3;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  lazy_ostream local_268;
  undefined1 *local_258;
  char **local_250;
  assertion_result local_248;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  size_t usage;
  CCoinsMap map;
  CoinsViewCacheCursor cursor;
  allocator_type local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  CCoinsMapMemoryResource resource;
  CoinsCachePair sentinel;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::pair<const_COutPoint,_CCoinsCacheEntry>::pair<const_COutPoint,_CCoinsCacheEntry,_true>
            (&sentinel);
  sentinel.second.m_flags = '\x01';
  sentinel.second.m_prev = &sentinel;
  sentinel.second.m_next = &sentinel;
  PoolResource<144UL,_8UL>::PoolResource(&resource);
  SaltedOutpointHasher::SaltedOutpointHasher((SaltedOutpointHasher *)&cursor,false);
  __a = &local_198;
  local_198.m_resource = &resource;
  std::
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&map._M_h,0,(SaltedOutpointHasher *)&cursor,(key_equal *)&local_268,__a);
  usage = InsertCoinsMapEntry(&map,&sentinel,value,flags);
  cursor.m_usage = &usage;
  cursor.m_will_erase = true;
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x278;
  file.m_begin = (iterator)&local_220;
  msg.m_end = in_R9;
  msg.m_begin = (iterator)__a;
  cursor.m_sentinel = &sentinel;
  cursor.m_map = &map;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_230,msg);
  local_188 = 0;
  uStack_180 = 0;
  local_198.m_resource = (PoolResource<144UL,_8UL> *)0x0;
  uStack_190 = 0;
  iVar2 = (*view->_vptr_CCoinsView[4])(view,&cursor);
  local_248.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       SUB41(iVar2,0);
  local_248.m_message.px = (element_type *)0x0;
  local_248.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_250 = &local_278;
  local_278 = "view.BatchWrite(cursor, {})";
  local_270 = "";
  local_268.m_empty = false;
  local_268._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_258 = boost::unit_test::lazy_ostream::inst;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_280 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_248,&local_268,1,0,WARN,_cVar3,(size_t)&local_288,0x278);
  boost::detail::shared_count::~shared_count(&local_248.m_message.pn);
  std::
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&map._M_h);
  PoolResource<144UL,_8UL>::~PoolResource(&resource);
  CCoinsCacheEntry::~CCoinsCacheEntry(&sentinel.second);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteCoinsViewEntry(CCoinsView& view, CAmount value, char flags)
{
    CoinsCachePair sentinel{};
    sentinel.second.SelfRef(sentinel);
    CCoinsMapMemoryResource resource;
    CCoinsMap map{0, CCoinsMap::hasher{}, CCoinsMap::key_equal{}, &resource};
    auto usage{InsertCoinsMapEntry(map, sentinel, value, flags)};
    auto cursor{CoinsViewCacheCursor(usage, sentinel, map, /*will_erase=*/true)};
    BOOST_CHECK(view.BatchWrite(cursor, {}));
}